

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O1

string * __thiscall
t_markdown_generator::str_to_id(string *__return_storage_ptr__,t_markdown_generator *this,string *s)

{
  char cVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (-1 < (long)s->_M_string_length) {
    pcVar2 = (s->_M_dataplus)._M_p;
    do {
      cVar1 = *pcVar2;
      if ((cVar1 != '\0') && (cVar1 != '.')) {
        tolower((int)cVar1);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 <= (s->_M_dataplus)._M_p + s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_markdown_generator::str_to_id(const std::string& s) {
  std::string id;
  for(auto chr=s.begin();chr<=s.end(); ++chr) {
    if(*chr == '.' || *chr == 0)
      continue;
    id += tolower(*chr); 
  }
  return id;
}